

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

stb_uint stb_decompress(stb_uchar *output,stb_uchar *i,stb_uint length)

{
  uchar *puVar1;
  stb_uint sVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ushort *puVar8;
  ushort *puVar9;
  
  uVar7 = *(uint *)i;
  if (((uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18) !=
       0x57bc0000) ||
     (uVar7 = *(uint *)(i + 4),
     ((uVar7 >> 0x18 != 0 || (uVar7 & 0xff0000) != 0) || (uVar7 & 0xff00) != 0) ||
     (uVar7 & 0xff) != 0)) {
    return 0;
  }
  uVar7 = *(uint *)(i + 8);
  uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  stb__barrier3 = i + length;
  puVar1 = output + uVar7;
  puVar8 = (ushort *)(i + 0x10);
  stb__barrier2 = i;
  stb__barrier = puVar1;
  stb__barrier4 = output;
  stb__dout = output;
  do {
    bVar5 = (byte)*puVar8;
    uVar6 = (uint)bVar5;
    if (bVar5 < 0x20) {
      if (bVar5 < 0x18) {
        if (bVar5 < 0x10) {
          if (bVar5 < 8) {
            if (bVar5 == 4) {
              stb__match(stb__dout +
                         ~((ulong)*(byte *)((long)puVar8 + 3) |
                           (ulong)*(byte *)((long)puVar8 + 1) << 0x10 | (ulong)(byte)puVar8[1] << 8)
                         ,(ushort)(puVar8[2] << 8 | puVar8[2] >> 8) + 1);
              puVar9 = puVar8 + 3;
              goto LAB_00158692;
            }
            if (uVar6 == 6) {
              uVar4 = ~((ulong)*(byte *)((long)puVar8 + 3) |
                        (ulong)*(byte *)((long)puVar8 + 1) << 0x10 | (ulong)(byte)puVar8[1] << 8);
              uVar6 = (uint)(byte)puVar8[2];
              goto LAB_001585c9;
            }
            if (uVar6 != 7) goto LAB_00158715;
            stb__lit((byte *)((long)puVar8 + 3),
                     (ushort)(*(ushort *)((long)puVar8 + 1) << 8 |
                             *(ushort *)((long)puVar8 + 1) >> 8) + 1);
            uVar4 = (ulong)(ushort)(*(ushort *)((long)puVar8 + 1) << 8 |
                                   *(ushort *)((long)puVar8 + 1) >> 8);
            lVar3 = 4;
          }
          else {
            stb__lit((stb_uchar *)(puVar8 + 1),
                     ((uint)bVar5 * 0x100 + (uint)*(byte *)((long)puVar8 + 1)) - 0x7ff);
            uVar4 = (ulong)(ushort)(*puVar8 << 8 | *puVar8 >> 8);
            lVar3 = -0x7fd;
          }
LAB_00158683:
          puVar9 = (ushort *)((long)puVar8 + uVar4 + lVar3);
          if (puVar9 == puVar8) {
            bVar5 = (byte)*puVar8;
LAB_00158715:
            if ((bVar5 != 5) || (*(byte *)((long)puVar8 + 1) != 0xfa)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                            ,0x27fb,"stb_uint stb_decompress(stb_uchar *, stb_uchar *, stb_uint)");
            }
            if (stb__dout != puVar1) {
              __assert_fail("stb__dout == output + olen",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                            ,0x27f5,"stb_uint stb_decompress(stb_uchar *, stb_uchar *, stb_uint)");
            }
            sVar2 = stb_adler32(1,output,uVar7);
            uVar6 = *(uint *)(puVar8 + 1);
            if (sVar2 != (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                         uVar6 << 0x18)) {
              return 0;
            }
            return uVar7;
          }
        }
        else {
          uVar4 = -(ulong)(((uint)*(byte *)((long)puVar8 + 1) * 0x100 +
                           ((uint)(byte)puVar8[1] | (uint)bVar5 << 0x10)) - 0xfffff);
          uVar6 = (uint)(ushort)(*(ushort *)((long)puVar8 + 3) << 8 |
                                *(ushort *)((long)puVar8 + 3) >> 8);
LAB_001585c9:
          stb__match(stb__dout + uVar4,uVar6 + 1);
          puVar9 = (ushort *)((long)puVar8 + 5);
        }
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar8 + 1) * 0x100 +
                            ((uint)(byte)puVar8[1] | (uint)bVar5 << 0x10)) - 0x17ffff),
                   *(byte *)((long)puVar8 + 3) + 1);
        puVar9 = puVar8 + 2;
      }
    }
    else if ((char)bVar5 < '\0') {
      stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar8 + 1),uVar6 - 0x7f);
      puVar9 = puVar8 + 1;
    }
    else {
      if (bVar5 < 0x40) {
        stb__lit((byte *)((long)puVar8 + 1),uVar6 - 0x1f);
        uVar4 = (ulong)(byte)*puVar8;
        lVar3 = -0x1e;
        goto LAB_00158683;
      }
      stb__match(stb__dout +
                 -(ulong)(((uint)*(byte *)((long)puVar8 + 1) + (uint)bVar5 * 0x100) - 0x3fff),
                 (byte)puVar8[1] + 1);
      puVar9 = (ushort *)((long)puVar8 + 3);
    }
LAB_00158692:
    puVar8 = puVar9;
    if (puVar1 < stb__dout) {
      __assert_fail("stb__dout <= output + olen",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x27ff,"stb_uint stb_decompress(stb_uchar *, stb_uchar *, stb_uint)");
    }
  } while( true );
}

Assistant:

stb_uint stb_decompress(stb_uchar *output, stb_uchar *i, stb_uint length)
{
   stb_uint olen;
   if (stb__in4(0) != 0x57bC0000) return 0;
   if (stb__in4(4) != 0)          return 0; // error! stream is > 4GB
   olen = stb_decompress_length(i);
   stb__barrier2 = i;
   stb__barrier3 = i+length;
   stb__barrier = output + olen;
   stb__barrier4 = output;
   i += 16;

   stb__dout = output;
   while (1) {
      stb_uchar *old_i = i;
      i = stb_decompress_token(i);
      if (i == old_i) {
         if (*i == 0x05 && i[1] == 0xfa) {
            assert(stb__dout == output + olen);
            if (stb__dout != output + olen) return 0;
            if (stb_adler32(1, output, olen) != (stb_uint) stb__in4(2))
               return 0;
            return olen;
         } else {
            assert(0); /* NOTREACHED */
            return 0;
         }
      }
      assert(stb__dout <= output + olen); 
      if (stb__dout > output + olen)
         return 0;
   }
}